

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter_tests.c
# Opt level: O2

void text_reporter_tests_teardown(void)

{
  (*reporter->destroy)(reporter);
  if (output != (char *)0x0) {
    free(output);
    output = (char *)0x0;
  }
  return;
}

Assistant:

static void text_reporter_tests_teardown(void) {
    reporter->destroy(reporter);

    // bad mojo when running tests in same process, as destroy_reporter
    // also sets context.reporter = NULL, thus breaking the next test
    // to run
    if (output != NULL) {
        free(output);
        // need to set output to NULL to avoid second free in
        // subsequent call to setup_*_reporter_tests->clear_output when
        // running tests in same process
        output = NULL;
    }
}